

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithColor.cpp
# Opt level: O3

raw_ostream * __thiscall
llvm::WithColor::error(WithColor *this,raw_ostream *OS,StringRef Prefix,bool DisableColors)

{
  raw_ostream *prVar1;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  WithColor local_28;
  
  Str.Length = Prefix.Data;
  if (Str.Length != (char *)0x0) {
    Str.Data = (char *)OS;
    prVar1 = raw_ostream::operator<<((raw_ostream *)this,Str);
    Str_00.Length = 2;
    Str_00.Data = ": ";
    raw_ostream::operator<<(prVar1,Str_00);
  }
  WithColor(&local_28,(raw_ostream *)this,Error,Prefix.Length._0_1_);
  Str_01.Length = 7;
  Str_01.Data = "error: ";
  prVar1 = raw_ostream::operator<<(local_28.OS,Str_01);
  ~WithColor(&local_28);
  return prVar1;
}

Assistant:

raw_ostream &WithColor::error(raw_ostream &OS, StringRef Prefix,
                              bool DisableColors) {
  if (!Prefix.empty())
    OS << Prefix << ": ";
  return WithColor(OS, HighlightColor::Error, DisableColors).get()
         << "error: ";
}